

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_cms_batch_query_metric.cc
# Opt level: O0

void anon_unknown.dwarf_12641::Json2Type(Value *value,CmsBatchQueryMetricResponseType *item)

{
  bool bVar1;
  Value *pVVar2;
  Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  CmsBatchQueryMetricResponseType *local_18;
  CmsBatchQueryMetricResponseType *item_local;
  Value *value_local;
  
  local_18 = item;
  item_local = (CmsBatchQueryMetricResponseType *)value;
  bVar1 = Json::Value::isMember(value,"Code");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"Code");
    Json::Value::asString_abi_cxx11_(&local_38,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->code,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Message");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"Message");
    Json::Value::asString_abi_cxx11_(&local_58,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->message,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Success");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"Success");
    Json::Value::asString_abi_cxx11_(&local_78,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->success,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"TraceId");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"TraceId");
    Json::Value::asString_abi_cxx11_(&local_98,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->trace_id,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Datapoints");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"Datapoints");
    bVar1 = Json::Value::isMember(pVVar2,"Datapoint");
    if (bVar1) {
      pVVar2 = Json::Value::operator[]((Value *)item_local,"Datapoints");
      pVVar2 = Json::Value::operator[](pVVar2,"Datapoint");
      Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      Json2Array(&local_99,pVVar2,&local_18->datapoints);
    }
  }
  return;
}

Assistant:

void Json2Type(const Json::Value& value, CmsBatchQueryMetricResponseType* item) {
  if(value.isMember("Code")) {
    item->code = value["Code"].asString();
  }
  if(value.isMember("Message")) {
    item->message = value["Message"].asString();
  }
  if(value.isMember("Success")) {
    item->success = value["Success"].asString();
  }
  if(value.isMember("TraceId")) {
    item->trace_id = value["TraceId"].asString();
  }
  if(value.isMember("Datapoints")  && value["Datapoints"].isMember("Datapoint")) {
    Json2Array<std::string>(value["Datapoints"]["Datapoint"], &item->datapoints);
  }
}